

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

void __thiscall cfd::CoinSelectionOption::CoinSelectionOption(CoinSelectionOption *this)

{
  this->use_bnb_ = true;
  this->change_output_size_ = 0;
  this->change_spend_size_ = 0;
  this->effective_fee_baserate_ = 20000;
  this->long_term_fee_baserate_ = 20000;
  this->knapsack_minimum_change_ = -1;
  this->dust_fee_rate_ = 3000;
  this->has_ignore_fee_asset_ = false;
  core::ConfidentialAssetId::ConfidentialAssetId(&this->fee_asset_);
  this->exponent_ = 0;
  this->minimum_bits_ = 0x34;
  return;
}

Assistant:

CoinSelectionOption::CoinSelectionOption()
    : effective_fee_baserate_(kDefaultLongTermFeeRate),
      long_term_fee_baserate_(kDefaultLongTermFeeRate),
      knapsack_minimum_change_(-1),
      dust_fee_rate_(kDustRelayTxFeeRate),
      has_ignore_fee_asset_(false) {
  // do nothing
}